

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O3

int modlist_add(mlist **mlist,lys_module *mod)

{
  mlist *pmVar1;
  LY_ERR *pLVar2;
  
  pmVar1 = (mlist *)mlist;
  do {
    pmVar1 = pmVar1->next;
    if (pmVar1 == (mlist *)0x0) {
      pmVar1 = (mlist *)malloc(0x10);
      if (pmVar1 != (mlist *)0x0) {
        pmVar1->next = *mlist;
        pmVar1->module = mod;
        *mlist = pmVar1;
        return 0;
      }
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","modlist_add");
      return 1;
    }
  } while (pmVar1->module != mod);
  return 0;
}

Assistant:

static int
modlist_add(struct mlist **mlist, const struct lys_module *mod)
{
    struct mlist *iter;

    for (iter = *mlist; iter; iter = iter->next) {
        if (mod == iter->module) {
            break;
        }
    }

    if (!iter) {
        iter = malloc(sizeof *iter);
        if (!iter) {
            LOGMEM;
            return EXIT_FAILURE;
        }
        iter->next = *mlist;
        iter->module = (struct lys_module *)mod;
        *mlist = iter;
    }

    return EXIT_SUCCESS;
}